

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::SetCompositionWindowPosition(CInput *this,float X,float Y,float H)

{
  float fVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long in_FS_OFFSET;
  undefined1 in_register_00001204 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined4 in_XMM1_Db;
  undefined1 auVar6 [16];
  
  auVar4._4_12_ = in_register_00001204;
  auVar4._0_4_ = X;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  fVar1 = (this->m_pGraphics->super_IGraphics).m_ScreenHiDPIScale;
  auVar6._0_8_ = auVar4._0_8_;
  auVar6._8_4_ = in_register_00001204._0_4_;
  auVar6._12_4_ = in_XMM1_Db;
  auVar5._8_8_ = auVar6._8_8_;
  auVar5._4_4_ = Y;
  auVar5._0_4_ = X;
  auVar3._4_4_ = fVar1;
  auVar3._0_4_ = fVar1;
  auVar3._8_4_ = fVar1;
  auVar3._12_4_ = fVar1;
  divps(auVar5,auVar3);
  SDL_SetTextInputRect();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CInput::SetCompositionWindowPosition(float X, float Y, float H)
{
	SDL_Rect Rect;
	Rect.x = X / m_pGraphics->ScreenHiDPIScale();
	Rect.y = Y / m_pGraphics->ScreenHiDPIScale();
	Rect.h = H / m_pGraphics->ScreenHiDPIScale();
	Rect.w = 0;
	SDL_SetTextInputRect(&Rect);
}